

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O2

void __thiscall chrono::ChShaft::VariablesQbSetSpeed(ChShaft *this,double step)

{
  double dVar1;
  Scalar *pSVar2;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_28 [24];
  
  dVar1 = this->pos_dt;
  ChVariables::Get_qb((ChVectorRef *)local_28,&(this->variables).super_ChVariables);
  pSVar2 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_28,0);
  this->pos_dt = *pSVar2;
  ClampSpeed(this);
  if ((step != 0.0) || (NAN(step))) {
    this->pos_dtdt = (this->pos_dt - dVar1) / step;
  }
  return;
}

Assistant:

void ChShaft::VariablesQbSetSpeed(double step) {
    double old_dt = pos_dt;

    // from 'qb' vector, sets body speed, and updates auxiliary data
    pos_dt = variables.Get_qb()(0);

    // apply limits (if in speed clamping mode) to speeds.
    ClampSpeed();

    // Compute accel. by BDF (approximate by differentiation);
    if (step) {
        pos_dtdt = (pos_dt - old_dt) / step;
    }
}